

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# borg-io.c
# Opt level: O3

errr borg_keypress(keycode_t k)

{
  int16_t iVar1;
  short sVar2;
  errr eVar3;
  long lVar4;
  
  iVar1 = borg_key_head;
  if (k == 0) {
    borg_note_internal(false," & Key * *BAD KEY * *");
    eVar3 = -1;
  }
  else {
    lVar4 = (long)borg_key_head;
    sVar2 = borg_key_head + 1;
    borg_key_head = sVar2;
    borg_key_queue[lVar4] = k;
    if (iVar1 == 0x1fff) {
      borg_key_head = 0;
      sVar2 = 0;
    }
    if (sVar2 == borg_key_tail) {
      borg_oops("overflow");
    }
    eVar3 = 0;
    if (borg_key_tail == 0x2000) {
      borg_key_tail = 0;
      eVar3 = 0;
    }
  }
  return eVar3;
}

Assistant:

errr borg_keypress(keycode_t k)
{
    /* Hack -- Refuse to enqueue "nul" */
    if (!k) {
        borg_note(" & Key * *BAD KEY * *");
        return (-1);
    }

    /* Store the char, advance the queue */
    borg_key_queue[borg_key_head++] = k;

    /* Circular queue, handle wrap */
    if (borg_key_head == KEY_SIZE)
        borg_key_head = 0;

    /* Hack -- Catch overflow (forget oldest) */
    if (borg_key_head == borg_key_tail)
        borg_oops("overflow");

    /* Hack -- Overflow may induce circular queue */
    if (borg_key_tail == KEY_SIZE)
        borg_key_tail = 0;

    /* Success */
    return 0;
}